

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::StatementSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if (((((((kind == AssertPropertyStatement) || (kind == AssumePropertyStatement)) ||
         (kind == BlockingEventTriggerStatement)) ||
        ((kind == CaseStatement || (kind == CheckerInstanceStatement)))) ||
       (kind == ConditionalStatement)) ||
      (((((kind - CoverPropertyStatement < 2 || (kind == DisableForkStatement)) ||
         ((kind == DisableStatement ||
          (((kind == DoWhileStatement || (kind == EmptyStatement)) ||
           (kind == ExpectPropertyStatement)))))) ||
        ((kind == ExpressionStatement || (kind == ForLoopStatement)))) ||
       (kind - ForeachLoopStatement < 2)))) ||
     ((((kind == ImmediateAssertStatement || (kind - ImmediateAssumeStatement < 2)) ||
       ((kind == JumpStatement ||
        (((kind == LoopStatement || (kind == NonblockingEventTriggerStatement)) ||
         (kind == ParallelBlockStatement)))))) ||
      (((kind - ProceduralAssignStatement < 4 || (kind == RandCaseStatement)) ||
       ((kind == RandSequenceStatement ||
        (((kind - RestrictPropertyStatement < 2 || (kind == SequentialBlockStatement)) ||
         ((kind == TimingControlStatement ||
          ((kind == VoidCastedCallStatement || (kind - WaitForkStatement < 3)))))))))))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool StatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssertPropertyStatement:
        case SyntaxKind::AssumePropertyStatement:
        case SyntaxKind::BlockingEventTriggerStatement:
        case SyntaxKind::CaseStatement:
        case SyntaxKind::CheckerInstanceStatement:
        case SyntaxKind::ConditionalStatement:
        case SyntaxKind::CoverPropertyStatement:
        case SyntaxKind::CoverSequenceStatement:
        case SyntaxKind::DisableForkStatement:
        case SyntaxKind::DisableStatement:
        case SyntaxKind::DoWhileStatement:
        case SyntaxKind::EmptyStatement:
        case SyntaxKind::ExpectPropertyStatement:
        case SyntaxKind::ExpressionStatement:
        case SyntaxKind::ForLoopStatement:
        case SyntaxKind::ForeachLoopStatement:
        case SyntaxKind::ForeverStatement:
        case SyntaxKind::ImmediateAssertStatement:
        case SyntaxKind::ImmediateAssumeStatement:
        case SyntaxKind::ImmediateCoverStatement:
        case SyntaxKind::JumpStatement:
        case SyntaxKind::LoopStatement:
        case SyntaxKind::NonblockingEventTriggerStatement:
        case SyntaxKind::ParallelBlockStatement:
        case SyntaxKind::ProceduralAssignStatement:
        case SyntaxKind::ProceduralDeassignStatement:
        case SyntaxKind::ProceduralForceStatement:
        case SyntaxKind::ProceduralReleaseStatement:
        case SyntaxKind::RandCaseStatement:
        case SyntaxKind::RandSequenceStatement:
        case SyntaxKind::RestrictPropertyStatement:
        case SyntaxKind::ReturnStatement:
        case SyntaxKind::SequentialBlockStatement:
        case SyntaxKind::TimingControlStatement:
        case SyntaxKind::VoidCastedCallStatement:
        case SyntaxKind::WaitForkStatement:
        case SyntaxKind::WaitOrderStatement:
        case SyntaxKind::WaitStatement:
            return true;
        default:
            return false;
    }
}